

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

void __thiscall
TCLAP::ArgParseException::ArgParseException(ArgParseException *this,string *text,string *id)

{
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *id_local;
  string *text_local;
  ArgParseException *this_local;
  
  local_20 = id;
  id_local = text;
  text_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Exception found while parsing ",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"the value the Arg has been passed.",&local_99);
  std::operator+(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  ArgException::ArgException(&this->super_ArgException,text,id,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  *(undefined ***)&this->super_ArgException = &PTR__ArgParseException_001bc6a0;
  return;
}

Assistant:

ArgParseException( const std::string& text = "undefined exception", 
					       const std::string& id = "undefined" )
			: ArgException( text, 
			                id, 
							std::string( "Exception found while parsing " ) + 
							std::string( "the value the Arg has been passed." ))
			{ }